

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

bool CountLowbitsCollisions<Blob<128>>
               (vector<Blob<128>,_std::allocator<Blob<128>_>_> *revhashes,int nbLBits)

{
  pointer pBVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Blob<128> h2;
  Blob<128> h1;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar3 = true;
  if (nbLBits < 0x80) {
    uVar7 = (long)(revhashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(revhashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    auVar11._0_8_ = (double)(int)uVar7;
    dVar9 = ldexp(1.0,nbLBits);
    auVar10._0_8_ = (auVar11._0_8_ * (double)((int)uVar7 + -1)) / dVar9;
    auVar10._8_8_ = 0;
    auVar11._8_8_ = 0;
    auVar10 = vminsd_avx(auVar11,auVar10);
    printf("Testing collisions (low  %2i-bit) - Expected %12.1f, ",(ulong)(uint)nbLBits);
    uVar8 = 0;
    if (1 < uVar7) {
      uVar8 = 0;
      uVar6 = 1;
      do {
        pBVar1 = (revhashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl.
                 super__Vector_impl_data._M_start + (uVar6 - 1);
        local_48 = *(undefined8 *)pBVar1->bytes;
        uStack_40 = *(undefined8 *)(pBVar1->bytes + 8);
        rshift32(&local_48,0x10,0x80 - nbLBits);
        pBVar1 = (revhashes->super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar6;
        local_58 = *(undefined8 *)pBVar1->bytes;
        uStack_50 = *(undefined8 *)(pBVar1->bytes + 8);
        rshift32(&local_58,0x10,0x80 - nbLBits);
        uVar4 = 0;
        if ((char)local_48 == (char)local_58) {
          uVar2 = 0;
          do {
            uVar5 = uVar2;
            if (uVar5 == 0xf) break;
            uVar2 = uVar5 + 1;
          } while (*(char *)((long)&local_48 + uVar5 + 1) == *(char *)((long)&local_58 + uVar5 + 1))
          ;
          uVar4 = (uint)(0xe < uVar5);
        }
        uVar8 = uVar8 + uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar7);
    }
    dVar9 = (double)(int)uVar8 / auVar10._0_8_;
    printf("actual %6i (%.2fx)",(ulong)uVar8);
    if ((0.98 < dVar9) && (uVar8 = uVar8 - (int)auVar10._0_8_, uVar8 != 0)) {
      printf(" (%i)",(ulong)uVar8);
    }
    if (2.0 < dVar9) {
      puts(" !!!!!");
    }
    else {
      putchar(10);
    }
    bVar3 = 2.0 >= dVar9;
  }
  return bVar3;
}

Assistant:

bool CountLowbitsCollisions ( std::vector<hashtype> & revhashes, int nbLBits)
{
  const int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbLBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = revhashes.size();
  double expected = EstimateNbCollisions(nbH, nbLBits);
  printf("Testing collisions (low  %2i-bit) - Expected %12.1f, ", nbLBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
#ifdef DEBUG
    hashtype const h1x = revhashes[hnb-1];
    hashtype const h2x = revhashes[hnb];
#endif
    hashtype const h1 = revhashes[hnb-1] >> shiftBy;
    hashtype const h2 = revhashes[hnb]   >> shiftBy;
    if(h1 == h2)
      collcount++;
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}